

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O0

bool __thiscall spvtools::opt::Instruction::IsFloatingPointFoldingAllowed(Instruction *this)

{
  bool bVar1;
  uint32_t id;
  FeatureManager *pFVar2;
  DecorationManager *this_00;
  anon_class_8_1_99d87628 local_48;
  function<bool_(const_spvtools::opt::Instruction_&)> local_40;
  bool local_19;
  Instruction *pIStack_18;
  bool is_nocontract;
  Instruction *this_local;
  
  pIStack_18 = this;
  pFVar2 = IRContext::get_feature_mgr(this->context_);
  bVar1 = FeatureManager::HasCapability(pFVar2,Shader);
  if (bVar1) {
    pFVar2 = IRContext::get_feature_mgr(this->context_);
    bVar1 = FeatureManager::HasCapability(pFVar2,DenormPreserve);
    if (!bVar1) {
      pFVar2 = IRContext::get_feature_mgr(this->context_);
      bVar1 = FeatureManager::HasCapability(pFVar2,DenormFlushToZero);
      if (!bVar1) {
        pFVar2 = IRContext::get_feature_mgr(this->context_);
        bVar1 = FeatureManager::HasCapability(pFVar2,SignedZeroInfNanPreserve);
        if (!bVar1) {
          pFVar2 = IRContext::get_feature_mgr(this->context_);
          bVar1 = FeatureManager::HasCapability(pFVar2,RoundingModeRTZ);
          if (!bVar1) {
            pFVar2 = IRContext::get_feature_mgr(this->context_);
            bVar1 = FeatureManager::HasCapability(pFVar2,RoundingModeRTE);
            if (!bVar1) {
              local_19 = false;
              this_00 = IRContext::get_decoration_mgr(this->context_);
              id = result_id(this);
              local_48.is_nocontract = &local_19;
              std::function<bool(spvtools::opt::Instruction_const&)>::
              function<spvtools::opt::Instruction::IsFloatingPointFoldingAllowed()const::__0,void>
                        ((function<bool(spvtools::opt::Instruction_const&)> *)&local_40,&local_48);
              analysis::DecorationManager::WhileEachDecoration(this_00,id,0x2a,&local_40);
              std::function<bool_(const_spvtools::opt::Instruction_&)>::~function(&local_40);
              return (bool)((local_19 ^ 0xffU) & 1);
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Instruction::IsFloatingPointFoldingAllowed() const {
  // TODO: Add the rules for kernels.  For now it will be pessimistic.
  // For now, do not support capabilities introduced by SPV_KHR_float_controls.
  if (!context_->get_feature_mgr()->HasCapability(spv::Capability::Shader) ||
      context_->get_feature_mgr()->HasCapability(
          spv::Capability::DenormPreserve) ||
      context_->get_feature_mgr()->HasCapability(
          spv::Capability::DenormFlushToZero) ||
      context_->get_feature_mgr()->HasCapability(
          spv::Capability::SignedZeroInfNanPreserve) ||
      context_->get_feature_mgr()->HasCapability(
          spv::Capability::RoundingModeRTZ) ||
      context_->get_feature_mgr()->HasCapability(
          spv::Capability::RoundingModeRTE)) {
    return false;
  }

  bool is_nocontract = false;
  context_->get_decoration_mgr()->WhileEachDecoration(
      result_id(), uint32_t(spv::Decoration::NoContraction),
      [&is_nocontract](const Instruction&) {
        is_nocontract = true;
        return false;
      });
  return !is_nocontract;
}